

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_gosmacs_transpose(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).buffer + 1 < (el->el_line).cursor) {
    wVar1 = (el->el_line).cursor[-2];
    (el->el_line).cursor[-2] = (el->el_line).cursor[-1];
    (el->el_line).cursor[-1] = wVar1;
    el_local._7_1_ = '\x04';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
em_gosmacs_transpose(EditLine *el, wint_t c)
{

	if (el->el_line.cursor > &el->el_line.buffer[1]) {
		/* must have at least two chars entered */
		c = el->el_line.cursor[-2];
		el->el_line.cursor[-2] = el->el_line.cursor[-1];
		el->el_line.cursor[-1] = c;
		return CC_REFRESH;
	} else
		return CC_ERROR;
}